

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_flush_flags(DisasContext_conflict2 *s)

{
  CCOp_conflict CVar1;
  TCGContext_conflict2 *tcg_ctx;
  uintptr_t o_10;
  TCGTemp *pTVar2;
  TCGv_i32 pTVar3;
  TCGTemp *pTVar4;
  uintptr_t o_1;
  TCGv_i32 pTVar5;
  uintptr_t o;
  uintptr_t o_12;
  TCGOpcode opc;
  uintptr_t o_11;
  uintptr_t o_13;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  switch(s->cc_op) {
  case CC_OP_DYNAMIC:
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = (TCGTemp *)(QREG_CC_OP + (long)tcg_ctx);
    tcg_gen_callN_m68k(tcg_ctx,helper_flush_flags_m68k,(TCGTemp *)0x0,2,&local_48);
    goto LAB_00701735;
  case CC_OP_FLAGS:
    goto switchD_00701471_caseD_1;
  case CC_OP_ADDB:
  case CC_OP_ADDW:
  case CC_OP_ADDL:
    if (QREG_CC_C != QREG_CC_X) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_C + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_X + (long)tcg_ctx));
    }
    if (QREG_CC_Z != QREG_CC_N) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_N + (long)tcg_ctx));
    }
    pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
    pTVar2 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_sub_i32(tcg_ctx,pTVar3,QREG_CC_N,QREG_CC_V);
    CVar1 = s->cc_op;
    if (CVar1 != CC_OP_ADDL) {
      if (CVar1 == CC_OP_ADDW) {
        tcg_gen_ext16s_i32_m68k(tcg_ctx,pTVar3,pTVar3);
      }
      else {
        if (CVar1 != CC_OP_ADDB) {
LAB_0070190d:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                     ,0x24c,(char *)0x0);
        }
        tcg_gen_ext8s_i32_m68k(tcg_ctx,pTVar3,pTVar3);
      }
    }
    pTVar5 = (TCGv_i32)((long)pTVar2 - (long)tcg_ctx);
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)pTVar2,(TCGArg)(QREG_CC_N + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_V + (long)tcg_ctx));
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_V + (long)tcg_ctx),(TCGArg)pTVar4);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    tcg_gen_andc_i32_m68k(tcg_ctx,QREG_CC_V,pTVar5,QREG_CC_V);
    goto LAB_00701834;
  case CC_OP_SUBB:
  case CC_OP_SUBW:
  case CC_OP_SUBL:
    if (QREG_CC_C != QREG_CC_X) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_C + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_X + (long)tcg_ctx));
    }
    if (QREG_CC_Z != QREG_CC_N) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_N + (long)tcg_ctx));
    }
    pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
    pTVar2 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_add_i32,(TCGArg)pTVar4,(TCGArg)(QREG_CC_N + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_V + (long)tcg_ctx));
    CVar1 = s->cc_op;
    if (CVar1 != CC_OP_SUBL) {
      if (CVar1 == CC_OP_SUBW) {
        tcg_gen_ext16s_i32_m68k(tcg_ctx,pTVar3,pTVar3);
      }
      else {
        if (CVar1 != CC_OP_SUBB) goto LAB_0070190d;
        tcg_gen_ext8s_i32_m68k(tcg_ctx,pTVar3,pTVar3);
      }
    }
    pTVar5 = (TCGv_i32)((long)pTVar2 - (long)tcg_ctx);
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)pTVar2,(TCGArg)(QREG_CC_N + (long)tcg_ctx),
                     (TCGArg)pTVar4);
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_V + (long)tcg_ctx),(TCGArg)pTVar4);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_and_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_V + (long)tcg_ctx),(TCGArg)pTVar2);
LAB_00701834:
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    break;
  case CC_OP_CMPB:
  case CC_OP_CMPW:
  case CC_OP_CMPL:
    tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_LTU,QREG_CC_C,QREG_CC_N,QREG_CC_V);
    tcg_gen_sub_i32(tcg_ctx,QREG_CC_Z,QREG_CC_N,QREG_CC_V);
    CVar1 = s->cc_op;
    if (CVar1 != CC_OP_CMPL) {
      if (CVar1 == CC_OP_CMPW) {
        tcg_gen_ext16s_i32_m68k(tcg_ctx,QREG_CC_Z,QREG_CC_Z);
      }
      else {
        if (CVar1 != CC_OP_CMPB) goto LAB_0070190d;
        tcg_gen_ext8s_i32_m68k(tcg_ctx,QREG_CC_Z,QREG_CC_Z);
      }
    }
    pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)pTVar4,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_N + (long)tcg_ctx));
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_V + (long)tcg_ctx),(TCGArg)(QREG_CC_N + (long)tcg_ctx));
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_and_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_V + (long)tcg_ctx),(TCGArg)pTVar4);
    tcg_temp_free_internal_m68k(tcg_ctx,pTVar4);
    if (QREG_CC_N != QREG_CC_Z) {
      pTVar5 = QREG_CC_Z + (long)tcg_ctx;
      opc = INDEX_op_mov_i32;
      pTVar3 = QREG_CC_N;
      goto LAB_007018f2;
    }
    break;
  case CC_OP_LOGIC:
    if (QREG_CC_Z != QREG_CC_N) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_N + (long)tcg_ctx));
    }
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_C + (long)tcg_ctx),0);
    opc = INDEX_op_movi_i32;
    pTVar5 = (TCGv_i32)0x0;
    pTVar3 = QREG_CC_V;
LAB_007018f2:
    tcg_gen_op2_m68k(tcg_ctx,opc,(TCGArg)(pTVar3 + (long)tcg_ctx),(TCGArg)pTVar5);
    break;
  default:
    pTVar3 = tcg_const_i32_m68k(tcg_ctx,s->cc_op);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    tcg_gen_callN_m68k(tcg_ctx,helper_flush_flags_m68k,(TCGTemp *)0x0,2,&local_48);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
LAB_00701735:
    s->cc_op_synced = 1;
  }
  s->cc_op = CC_OP_FLAGS;
switchD_00701471_caseD_1:
  return;
}

Assistant:

static void gen_flush_flags(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv t0, t1;

    switch (s->cc_op) {
    case CC_OP_FLAGS:
        return;

    case CC_OP_ADDB:
    case CC_OP_ADDW:
    case CC_OP_ADDL:
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
        /* Compute signed overflow for addition.  */
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_sub_i32(tcg_ctx, t0, QREG_CC_N, QREG_CC_V);
        gen_ext(tcg_ctx, t0, t0, s->cc_op - CC_OP_ADDB, 1);
        tcg_gen_xor_i32(tcg_ctx, t1, QREG_CC_N, QREG_CC_V);
        tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t0);
        tcg_temp_free(tcg_ctx, t0);
        tcg_gen_andc_i32(tcg_ctx, QREG_CC_V, t1, QREG_CC_V);
        tcg_temp_free(tcg_ctx, t1);
        break;

    case CC_OP_SUBB:
    case CC_OP_SUBW:
    case CC_OP_SUBL:
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
        /* Compute signed overflow for subtraction.  */
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_add_i32(tcg_ctx, t0, QREG_CC_N, QREG_CC_V);
        gen_ext(tcg_ctx, t0, t0, s->cc_op - CC_OP_SUBB, 1);
        tcg_gen_xor_i32(tcg_ctx, t1, QREG_CC_N, t0);
        tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t0);
        tcg_temp_free(tcg_ctx, t0);
        tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t1);
        tcg_temp_free(tcg_ctx, t1);
        break;

    case CC_OP_CMPB:
    case CC_OP_CMPW:
    case CC_OP_CMPL:
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_C, QREG_CC_N, QREG_CC_V);
        tcg_gen_sub_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, QREG_CC_V);
        gen_ext(tcg_ctx, QREG_CC_Z, QREG_CC_Z, s->cc_op - CC_OP_CMPB, 1);
        /* Compute signed overflow for subtraction.  */
        t0 = tcg_temp_new(tcg_ctx);
        tcg_gen_xor_i32(tcg_ctx, t0, QREG_CC_Z, QREG_CC_N);
        tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, QREG_CC_N);
        tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t0);
        tcg_temp_free(tcg_ctx, t0);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_N, QREG_CC_Z);
        break;

    case CC_OP_LOGIC:
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
        break;

    case CC_OP_DYNAMIC:
        gen_helper_flush_flags(tcg_ctx, tcg_ctx->cpu_env, QREG_CC_OP);
        s->cc_op_synced = 1;
        break;

    default:
        t0 = tcg_const_i32(tcg_ctx, s->cc_op);
        gen_helper_flush_flags(tcg_ctx, tcg_ctx->cpu_env, t0);
        tcg_temp_free(tcg_ctx, t0);
        s->cc_op_synced = 1;
        break;
    }

    /* Note that flush_flags also assigned to env->cc_op.  */
    s->cc_op = CC_OP_FLAGS;
}